

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O0

void update_nsv_queue<unsigned_long,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *q,unsigned_long *next_value,size_t idx,size_t prefix)

{
  ulong uVar1;
  unsigned_long uVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  bool bVar6;
  size_t prefix_local;
  size_t idx_local;
  unsigned_long *next_value_local;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *q_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv_local;
  
  while( true ) {
    bVar3 = std::
            deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::empty(q);
    bVar6 = false;
    if (!bVar3) {
      uVar1 = *next_value;
      pvVar4 = std::
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::back(q);
      bVar6 = uVar1 < pvVar4->first;
    }
    if (!bVar6) break;
    pvVar4 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::back(q);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (nsv,pvVar4->second - prefix);
    *pvVar5 = idx;
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::pop_back(q);
  }
  bVar6 = std::
          deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty(q);
  if (!bVar6) {
    uVar2 = *next_value;
    pvVar4 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::back(q);
    if (uVar2 == pvVar4->first) {
      pvVar4 = std::
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::back(q);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (nsv,pvVar4->second - prefix);
      *pvVar5 = idx;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(q);
    }
  }
  return;
}

Assistant:

inline void update_nsv_queue(std::vector<size_t>& nsv, std::deque<std::pair<T,size_t>>& q, const T& next_value, size_t idx, size_t prefix) {
    while (!q.empty() && next_value < q.back().first) {
        // current element is the min for in[i-1]
        nsv[q.back().second-prefix] = idx;
        if (type == furthest_eq) {
            // if that element is followed in the queue by equal elements,
            // set them to the furthest
            std::pair<T,size_t> furthest = q.back();
            q.pop_back();
            while (!q.empty() && furthest.first == q.back().first) {
                nsv[q.back().second-prefix] = furthest.second;
                q.pop_back();
            }
        } else {
            q.pop_back();
        }
    }
    if (type == nearest_eq) {
        if (!q.empty() && next_value == q.back().first) {
            // replace the equal element
            nsv[q.back().second-prefix] = idx;
            q.pop_back();
        }
    }
}